

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O0

int __thiscall clunk::Node::KnightEval<false>(Node *this,uint8_t (*fileInfo) [10])

{
  uint from;
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uStack_38;
  int to;
  uint64_t mvs;
  int mob;
  int y;
  int x;
  int sqr;
  int i;
  int score;
  uint8_t (*fileInfo_local) [10];
  Node *this_local;
  
  if (fileInfo == (uint8_t (*) [10])0x0) {
    __assert_fail("fileInfo",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xd43,"int clunk::Node::KnightEval(const uint8_t (*)[10]) [color = false]");
  }
  sqr = 0;
  if (1 < DAT_00194990) {
    sqr = (DAT_00194990 + -1) * -0x10;
  }
  x = DAT_00194990;
  while( true ) {
    iVar4 = x + -1;
    if (x == 0) {
      this->scoreType[4] = sqr;
      this->scoreType[0x12] = sqr + this->scoreType[0x12];
      return sqr;
    }
    if (iVar4 < 0) {
      __assert_fail("i >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xd4d,"int clunk::Node::KnightEval(const uint8_t (*)[10]) [color = false]");
    }
    from = (uint)(byte)(&DAT_001948b1)[(long)(x + 0x13) * 2];
    if (((&DAT_001948b1)[(long)(x + 0x13) * 2] & 0x88) != 0) {
      __assert_fail("IS_SQUARE(sqr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xd4f,"int clunk::Node::KnightEval(const uint8_t (*)[10]) [color = false]");
    }
    if ((&_board)[(int)from] != (long)iVar4 * 2 + 0x1948d8) break;
    if (*(char *)(&_board)[(int)from] != '\x04') {
      __assert_fail("_board[sqr]->type == (color|Knight)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xd51,"int clunk::Node::KnightEval(const uint8_t (*)[10]) [color = false]");
    }
    if (*(byte *)((&_board)[(int)from] + 1) != from) {
      __assert_fail("_board[sqr]->sqr == sqr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xd52,"int clunk::Node::KnightEval(const uint8_t (*)[10]) [color = false]");
    }
    uVar1 = from & 0xf;
    if (DAT_0019498c != 0) {
      sqr = (uint)(2 < from / 0x10) * 4 *
            (uint)((uint)fileInfo[1][(int)(uVar1 + 1)] == from / 0x10 + 0x10) +
            (uint)(((fileInfo[1][(int)uVar1] != '\0' || fileInfo[1][(int)(uVar1 + 2)] != '\0') ^
                   0xffU) & 1) * 4 + sqr;
    }
    mvs._0_4_ = 0;
    for (uStack_38 = *(ulong *)(_knightMoves + (long)(int)from * 8); uStack_38 != 0;
        uStack_38 = uStack_38 >> 8) {
      if ((uStack_38 & 0xff) != 0) {
        uVar1 = ((uint)uStack_38 & 0xff) - 1;
        if ((uVar1 & 0xffffff88) != 0) {
          __assert_fail("IS_SQUARE(to)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xd64,"int clunk::Node::KnightEval(const uint8_t (*)[10]) [color = false]")
          ;
        }
        if (uVar1 == from) {
          __assert_fail("to != sqr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xd65,"int clunk::Node::KnightEval(const uint8_t (*)[10]) [color = false]")
          ;
        }
        mvs._0_4_ = ((*(char *)(&_board)[(int)uVar1] != '\0' ^ 0xffU) & 1 |
                    (*(byte *)(&_board)[(int)uVar1] & 1) != 0) + (uint)mvs;
      }
    }
    if (8 < (uint)mvs) {
      __assert_fail("(mob >= 0) & (mob <= 8)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xd69,"int clunk::Node::KnightEval(const uint8_t (*)[10]) [color = false]");
    }
    iVar2 = Distance(from,(uint)(byte)_KING[1]);
    iVar3 = Distance(from,(uint)(byte)PTR_DAT_001883a8[1]);
    sqr = (8 - (iVar2 + iVar3)) +
          (uint)mvs + (uint)(((uint)mvs != 0 ^ 0xffU) & 1) * -0x10 + (uint)((uint)mvs == 1) * -4 +
          sqr;
    x = iVar4;
  }
  __assert_fail("_board[sqr] == (_piece + KnightOffset + i + (10 * color))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                ,0xd50,"int clunk::Node::KnightEval(const uint8_t (*)[10]) [color = false]");
}

Assistant:

int KnightEval(const uint8_t fileInfo[2][10]) {
    assert(fileInfo);
    assert((KnightOffset + 10) == BlackKnightOffset);
    int score = 0;

    // redundant knights are worth slightly less
    if (_pcount[color|Knight] > 1) {
      score -= (16 * (_pcount[color|Knight] - 1));
    }

    for (int i = _pcount[color|Knight]; i--; ) {
      assert(i >= 0);
      const int sqr = _piece[KnightOffset + i + (10 * color)].sqr;
      assert(IS_SQUARE(sqr));
      assert(_board[sqr] == (_piece + KnightOffset + i + (10 * color)));
      assert(_board[sqr]->type == (color|Knight));
      assert(_board[sqr]->sqr == sqr);

      const int x = XC(sqr);
      const int y = YC(sqr);
      if (_pcount[(!color)|Pawn]) {
        // bonus if can't be menaced by enemy pawns
        score += (4 * !(fileInfo[!color][x] | fileInfo[!color][x + 2]));

        // bonus if blocking a backward pawn
        score += (4 * (color ? (y < 5) : (y > 2)) *
                  (fileInfo[!color][x + 1] == (y + (color ? South : North))));
      }

      // mobility bonus/penalty
      int mob = 0;
      for (uint64_t mvs = _knightMoves[sqr]; mvs; mvs >>= 8) {
        if (mvs & 0xFF) {
          const int to = ((mvs & 0xFF) - 1);
          assert(IS_SQUARE(to));
          assert(to != sqr);
          mob += ((!_board[to]->type) | (COLOR(_board[to]->type) != color));
        }
      }
      assert((mob >= 0) & (mob <= 8));
      score += (mob - (16 * !mob) - (4 * (mob == 1)));

      // keep knights close to the kings
      score += (8 - (Distance(sqr, _KING[White]->sqr) +
                     Distance(sqr, _KING[Black]->sqr)));
    }

#ifndef NDEBUG
    scoreType[color|Knight] = score;
    scoreType[color|Total] += score;
#endif

    return score;
  }